

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource
          (EnumGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  _Alloc_hider _Var3;
  int iVar4;
  pointer ppEVar5;
  EnumValueDescriptor *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *name;
  EnumValueDescriptor *extraout_RDX_02;
  EnumValueDescriptor *extraout_RDX_03;
  EnumValueDescriptor *extraout_RDX_04;
  EnumValueDescriptor *extraout_RDX_05;
  EnumValueDescriptor *extraout_RDX_06;
  EnumValueDescriptor *extraout_RDX_07;
  EnumValueDescriptor *extraout_RDX_08;
  EnumValueDescriptor *extraout_RDX_09;
  EnumValueDescriptor *extraout_RDX_10;
  EnumValueDescriptor *extraout_RDX_11;
  EnumValueDescriptor *pEVar6;
  ulong uVar7;
  bool bVar8;
  string short_name;
  __string_type __str;
  string text_blob;
  TextFormatDecodeData text_format_decode_data;
  string local_d0;
  string local_b0;
  string *local_90;
  undefined1 *local_88;
  ulong local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  TextFormatDecodeData local_68;
  string local_50;
  
  local_90 = &this->name_;
  io::Printer::Print(printer,"#pragma mark - Enum $name$\n\n","name",local_90);
  TextFormatDecodeData::TextFormatDecodeData(&local_68);
  local_88 = &local_78;
  local_80 = 0;
  local_78 = 0;
  ppEVar5 = (this->all_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar5) {
    paVar1 = &local_b0.field_2;
    uVar7 = 0;
    pEVar6 = extraout_RDX;
    do {
      EnumValueShortName_abi_cxx11_(&local_d0,(objectivec *)ppEVar5[uVar7],pEVar6);
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_b0._M_string_length,0,'\x01');
      std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_b0._M_dataplus._M_p);
      name = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        name = extraout_RDX_01;
      }
      UnCamelCaseEnumShortName(&local_b0,(objectivec *)&local_d0,name);
      _Var3._M_p = local_b0._M_dataplus._M_p;
      puVar2 = *(undefined8 **)
                (this->all_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar7];
      pEVar6 = (EnumValueDescriptor *)local_b0._M_string_length;
      if ((EnumValueDescriptor *)local_b0._M_string_length == (EnumValueDescriptor *)puVar2[1]) {
        if ((EnumValueDescriptor *)local_b0._M_string_length == (EnumValueDescriptor *)0x0) {
          bVar8 = false;
        }
        else {
          iVar4 = bcmp(local_b0._M_dataplus._M_p,(void *)*puVar2,local_b0._M_string_length);
          bVar8 = iVar4 != 0;
          pEVar6 = extraout_RDX_02;
        }
      }
      else {
        bVar8 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != paVar1) {
        operator_delete(_Var3._M_p,local_b0.field_2._M_allocated_capacity + 1);
        pEVar6 = extraout_RDX_03;
      }
      if (bVar8) {
        TextFormatDecodeData::AddString
                  (&local_68,(int32)uVar7,&local_d0,
                   *(string **)
                    (this->all_values_).
                    super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar7]);
        pEVar6 = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        pEVar6 = extraout_RDX_05;
      }
      uVar7 = uVar7 + 1;
      ppEVar5 = (this->all_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->all_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3))
    ;
  }
  io::Printer::Print(printer,
                     "GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n  static GPBEnumDescriptor *descriptor = NULL;\n  if (!descriptor) {\n"
                     ,"name",local_90);
  io::Printer::Print(printer,"    static const char *valueNames =");
  if (local_80 != 0) {
    uVar7 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_88);
      CEscape(&local_b0,&local_50);
      EscapeTrigraphs(&local_d0,&local_b0);
      io::Printer::Print(printer,"\n        \"$data$\"","data",&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 0x28;
    } while (uVar7 < local_80);
  }
  io::Printer::Print(printer,";\n    static const int32_t values[] = {\n");
  ppEVar5 = (this->all_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar5) {
    uVar7 = 0;
    pEVar6 = extraout_RDX_06;
    do {
      EnumValueName_abi_cxx11_(&local_d0,(objectivec *)ppEVar5[uVar7],pEVar6);
      io::Printer::Print(printer,"        $name$,\n","name",&local_d0);
      pEVar6 = extraout_RDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        pEVar6 = extraout_RDX_08;
      }
      uVar7 = uVar7 + 1;
      ppEVar5 = (this->all_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->all_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3))
    ;
  }
  io::Printer::Print(printer,"    };\n");
  if (local_68.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_68.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::Printer::Print(printer,
                       "    GPBEnumDescriptor *worker =\n        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                       valueNames:valueNames\n                                           values:values\n                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                     enumVerifier:$name$_IsValidValue];\n"
                       ,"name",local_90);
  }
  else {
    TextFormatDecodeData::Data_abi_cxx11_(&local_b0,&local_68);
    CEscape(&local_d0,&local_b0);
    io::Printer::Print(printer,
                       "    static const char *extraTextFormatInfo = \"$extraTextFormatInfo$\";\n    GPBEnumDescriptor *worker =\n        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                       valueNames:valueNames\n                                           values:values\n                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                     enumVerifier:$name$_IsValidValue\n                              extraTextFormatInfo:extraTextFormatInfo];\n"
                       ,"name",local_90,"extraTextFormatInfo",&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Print(printer,
                     "    if (!OSAtomicCompareAndSwapPtrBarrier(nil, worker, (void * volatile *)&descriptor)) {\n      [worker release];\n    }\n  }\n  return descriptor;\n}\n\n"
                    );
  io::Printer::Print(printer,"BOOL $name$_IsValidValue(int32_t value__) {\n  switch (value__) {\n",
                     "name",local_90);
  ppEVar5 = (this->base_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->base_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar5) {
    uVar7 = 0;
    pEVar6 = extraout_RDX_09;
    do {
      EnumValueName_abi_cxx11_(&local_d0,(objectivec *)ppEVar5[uVar7],pEVar6);
      io::Printer::Print(printer,"    case $name$:\n","name",&local_d0);
      pEVar6 = extraout_RDX_10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        pEVar6 = extraout_RDX_11;
      }
      uVar7 = uVar7 + 1;
      ppEVar5 = (this->base_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->base_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3))
    ;
  }
  io::Printer::Print(printer,"      return YES;\n    default:\n      return NO;\n  }\n}\n\n");
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  TextFormatDecodeData::~TextFormatDecodeData(&local_68);
  return;
}

Assistant:

void EnumGenerator::GenerateSource(io::Printer* printer) {
  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  // Note: For the TextFormat decode info, we can't use the enum value as
  // the key because protocol buffer enums have 'allow_alias', which lets
  // a value be used more than once. Instead, the index into the list of
  // enum value descriptions is used. Note: start with -1 so the first one
  // will be zero.
  TextFormatDecodeData text_format_decode_data;
  int enum_value_description_key = -1;
  string text_blob;

  for (int i = 0; i < all_values_.size(); i++) {
    ++enum_value_description_key;
    string short_name(EnumValueShortName(all_values_[i]));
    text_blob += short_name + '\0';
    if (UnCamelCaseEnumShortName(short_name) != all_values_[i]->name()) {
      text_format_decode_data.AddString(enum_value_description_key, short_name,
                                        all_values_[i]->name());
    }
  }

  printer->Print(
      "GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n"
      "  static GPBEnumDescriptor *descriptor = NULL;\n"
      "  if (!descriptor) {\n",
      "name", name_);

  static const int kBytesPerLine = 40;  // allow for escaping
  printer->Print(
      "    static const char *valueNames =");
  for (int i = 0; i < text_blob.size(); i += kBytesPerLine) {
    printer->Print(
        "\n        \"$data$\"",
        "data", EscapeTrigraphs(CEscape(text_blob.substr(i, kBytesPerLine))));
  }
  printer->Print(
      ";\n"
      "    static const int32_t values[] = {\n");
  for (int i = 0; i < all_values_.size(); i++) {
    printer->Print("        $name$,\n",  "name", EnumValueName(all_values_[i]));
  }
  printer->Print("    };\n");

  if (text_format_decode_data.num_entries() == 0) {
    printer->Print(
        "    GPBEnumDescriptor *worker =\n"
        "        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n"
        "                                       valueNames:valueNames\n"
        "                                           values:values\n"
        "                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n"
        "                                     enumVerifier:$name$_IsValidValue];\n",
        "name", name_);
    } else {
      printer->Print(
        "    static const char *extraTextFormatInfo = \"$extraTextFormatInfo$\";\n"
        "    GPBEnumDescriptor *worker =\n"
        "        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n"
        "                                       valueNames:valueNames\n"
        "                                           values:values\n"
        "                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n"
        "                                     enumVerifier:$name$_IsValidValue\n"
        "                              extraTextFormatInfo:extraTextFormatInfo];\n",
        "name", name_,
        "extraTextFormatInfo", CEscape(text_format_decode_data.Data()));
    }
    printer->Print(
      "    if (!OSAtomicCompareAndSwapPtrBarrier(nil, worker, (void * volatile *)&descriptor)) {\n"
      "      [worker release];\n"
      "    }\n"
      "  }\n"
      "  return descriptor;\n"
      "}\n\n");

  printer->Print(
      "BOOL $name$_IsValidValue(int32_t value__) {\n"
      "  switch (value__) {\n",
      "name", name_);

  for (int i = 0; i < base_values_.size(); i++) {
    printer->Print(
        "    case $name$:\n",
        "name", EnumValueName(base_values_[i]));
  }

  printer->Print(
      "      return YES;\n"
      "    default:\n"
      "      return NO;\n"
      "  }\n"
      "}\n\n");
}